

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sysinfo.cc
# Opt level: O0

void benchmark::anon_unknown_1::InitializeSystemInfo(void)

{
  bool bVar1;
  int iVar2;
  int64_t iVar3;
  double dVar4;
  long cpu_id;
  char *id_str;
  char *freqstr_1;
  char *freqstr;
  size_t bytes_to_read;
  size_t linelen;
  char *newline;
  size_t oldlinelen;
  size_t chars_read;
  int num_cpus;
  long max_cpu_id;
  bool saw_bogo;
  double bogo_clock;
  int fd;
  char *pname;
  bool saw_mhz;
  long freq;
  char *err;
  char line [1024];
  CheckHandler *this;
  char *in_stack_fffffffffffffb48;
  char *in_stack_fffffffffffffb50;
  char *in_stack_fffffffffffffb58;
  CheckHandler *in_stack_fffffffffffffb60;
  CheckHandler local_480;
  size_t local_478;
  size_t local_470;
  char *local_468;
  size_t local_460;
  ssize_t local_458;
  int local_44c;
  char *local_448;
  byte local_439;
  double local_438;
  int local_42c;
  char *local_428;
  byte local_419;
  long local_418;
  char *local_410;
  char local_408 [896];
  long *in_stack_ffffffffffffff78;
  char *in_stack_ffffffffffffff80;
  
  local_419 = 0;
  bVar1 = ReadIntFromFile(in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
  if (bVar1) {
    (anonymous_namespace)::cpuinfo_cycles_per_second = (double)local_418 * 1000.0;
    local_419 = 1;
  }
  if (((local_419 & 1) == 0) &&
     (bVar1 = ReadIntFromFile(in_stack_ffffffffffffff80,in_stack_ffffffffffffff78), bVar1)) {
    (anonymous_namespace)::cpuinfo_cycles_per_second = (double)local_418 * 1000.0;
    local_419 = 1;
  }
  local_428 = "/proc/cpuinfo";
  local_42c = open("/proc/cpuinfo",0);
  if (local_42c == -1) {
    perror(local_428);
    if ((local_419 & 1) == 0) {
      iVar3 = EstimateCyclesPerSecond();
      (anonymous_namespace)::cpuinfo_cycles_per_second = (double)iVar3;
    }
  }
  else {
    local_438 = 1.0;
    local_439 = 0;
    local_448 = (char *)0x0;
    local_44c = 0;
    local_408[1] = 0;
    local_408[0] = '\0';
    local_458 = 0;
    do {
      local_460 = strlen(local_408);
      if (local_460 == 0x3ff) {
        local_408[0] = '\0';
      }
      else {
        memmove(local_408,local_408 + local_460 + 1,0x400 - (local_460 + 1));
      }
      local_468 = strchr(local_408,10);
      if (local_468 == (char *)0x0) {
        local_470 = strlen(local_408);
        local_478 = 0x3ff - local_470;
        if (local_478 == 0) {
          this = &local_480;
          internal::CheckHandler::CheckHandler
                    (in_stack_fffffffffffffb60,in_stack_fffffffffffffb58,in_stack_fffffffffffffb50,
                     in_stack_fffffffffffffb48,(int)((ulong)this >> 0x20));
          internal::CheckHandler::GetLog(this);
          internal::CheckHandler::~CheckHandler((CheckHandler *)&LAB_0017df71);
        }
        internal::GetNullLogInstance();
        local_458 = read(local_42c,local_408 + local_470,local_478);
        local_408[local_470 + local_458] = '\0';
        local_468 = strchr(local_408,10);
      }
      if (local_468 != (char *)0x0) {
        *local_468 = '\0';
      }
      if (((local_419 & 1) == 0) && (iVar2 = strncasecmp(local_408,"cpu MHz",7), iVar2 == 0)) {
        in_stack_fffffffffffffb60 = (CheckHandler *)strchr(local_408,0x3a);
        if (in_stack_fffffffffffffb60 != (CheckHandler *)0x0) {
          dVar4 = strtod((char *)((long)&in_stack_fffffffffffffb60->log_ + 1),&local_410);
          (anonymous_namespace)::cpuinfo_cycles_per_second = dVar4 * 1000000.0;
          if (((*(char *)((long)&in_stack_fffffffffffffb60->log_ + 1) != '\0') &&
              (*local_410 == '\0')) && (0.0 < (anonymous_namespace)::cpuinfo_cycles_per_second)) {
            local_419 = 1;
          }
        }
      }
      else {
        iVar2 = strncasecmp(local_408,"bogomips",8);
        if (iVar2 == 0) {
          in_stack_fffffffffffffb58 = strchr(local_408,0x3a);
          if (in_stack_fffffffffffffb58 != (char *)0x0) {
            local_438 = strtod(in_stack_fffffffffffffb58 + 1,&local_410);
            local_438 = local_438 * 1000000.0;
            if (((in_stack_fffffffffffffb58[1] != '\0') && (*local_410 == '\0')) &&
               (0.0 < local_438)) {
              local_439 = 1;
            }
          }
        }
        else {
          iVar2 = strncmp(local_408,"processor",9);
          if (iVar2 == 0) {
            local_44c = local_44c + 1;
            in_stack_fffffffffffffb50 = strchr(local_408,0x3a);
            if ((((in_stack_fffffffffffffb50 != (char *)0x0) &&
                 (in_stack_fffffffffffffb48 =
                       (char *)strtol(in_stack_fffffffffffffb50 + 1,&local_410,10),
                 in_stack_fffffffffffffb50[1] != '\0')) && (*local_410 == '\0')) &&
               ((long)local_448 < (long)in_stack_fffffffffffffb48)) {
              local_448 = in_stack_fffffffffffffb48;
            }
          }
        }
      }
    } while (local_458 != 0);
    close(local_42c);
    if ((local_419 & 1) == 0) {
      if ((local_439 & 1) == 0) {
        iVar3 = EstimateCyclesPerSecond();
        (anonymous_namespace)::cpuinfo_cycles_per_second = (double)iVar3;
      }
      else {
        (anonymous_namespace)::cpuinfo_cycles_per_second = local_438;
      }
    }
    if (local_44c == 0) {
      fprintf(_stderr,"Failed to read num. CPUs correctly from /proc/cpuinfo\n");
    }
    else {
      if (local_448 + 1 != (char *)(long)local_44c) {
        fprintf(_stderr,
                "CPU ID assignments in /proc/cpuinfo seem messed up. This is usually caused by a bad BIOS.\n"
               );
      }
      (anonymous_namespace)::cpuinfo_num_cpus = local_44c;
    }
  }
  return;
}

Assistant:

void InitializeSystemInfo() {
#if defined BENCHMARK_OS_LINUX || defined BENCHMARK_OS_CYGWIN
  char line[1024];
  char* err;
  long freq;

  bool saw_mhz = false;

  // If the kernel is exporting the tsc frequency use that. There are issues
  // where cpuinfo_max_freq cannot be relied on because the BIOS may be
  // exporintg an invalid p-state (on x86) or p-states may be used to put the
  // processor in a new mode (turbo mode). Essentially, those frequencies
  // cannot always be relied upon. The same reasons apply to /proc/cpuinfo as
  // well.
  if (!saw_mhz &&
      ReadIntFromFile("/sys/devices/system/cpu/cpu0/tsc_freq_khz", &freq)) {
    // The value is in kHz (as the file name suggests).  For example, on a
    // 2GHz warpstation, the file contains the value "2000000".
    cpuinfo_cycles_per_second = freq * 1000.0;
    saw_mhz = true;
  }

  // If CPU scaling is in effect, we want to use the *maximum* frequency,
  // not whatever CPU speed some random processor happens to be using now.
  if (!saw_mhz &&
      ReadIntFromFile("/sys/devices/system/cpu/cpu0/cpufreq/cpuinfo_max_freq",
                      &freq)) {
    // The value is in kHz.  For example, on a 2GHz warpstation, the file
    // contains the value "2000000".
    cpuinfo_cycles_per_second = freq * 1000.0;
    saw_mhz = true;
  }

  // Read /proc/cpuinfo for other values, and if there is no cpuinfo_max_freq.
  const char* pname = "/proc/cpuinfo";
  int fd = open(pname, O_RDONLY);
  if (fd == -1) {
    perror(pname);
    if (!saw_mhz) {
      cpuinfo_cycles_per_second = static_cast<double>(EstimateCyclesPerSecond());
    }
    return;
  }

  double bogo_clock = 1.0;
  bool saw_bogo = false;
  long max_cpu_id = 0;
  int num_cpus = 0;
  line[0] = line[1] = '\0';
  size_t chars_read = 0;
  do {  // we'll exit when the last read didn't read anything
    // Move the next line to the beginning of the buffer
    const size_t oldlinelen = strlen(line);
    if (sizeof(line) == oldlinelen + 1)  // oldlinelen took up entire line
      line[0] = '\0';
    else  // still other lines left to save
      memmove(line, line + oldlinelen + 1, sizeof(line) - (oldlinelen + 1));
    // Terminate the new line, reading more if we can't find the newline
    char* newline = strchr(line, '\n');
    if (newline == nullptr) {
      const size_t linelen = strlen(line);
      const size_t bytes_to_read = sizeof(line) - 1 - linelen;
      CHECK(bytes_to_read > 0);  // because the memmove recovered >=1 bytes
      chars_read = read(fd, line + linelen, bytes_to_read);
      line[linelen + chars_read] = '\0';
      newline = strchr(line, '\n');
    }
    if (newline != nullptr) *newline = '\0';

    // When parsing the "cpu MHz" and "bogomips" (fallback) entries, we only
    // accept postive values. Some environments (virtual machines) report zero,
    // which would cause infinite looping in WallTime_Init.
    if (!saw_mhz && strncasecmp(line, "cpu MHz", sizeof("cpu MHz") - 1) == 0) {
      const char* freqstr = strchr(line, ':');
      if (freqstr) {
        cpuinfo_cycles_per_second = strtod(freqstr + 1, &err) * 1000000.0;
        if (freqstr[1] != '\0' && *err == '\0' && cpuinfo_cycles_per_second > 0)
          saw_mhz = true;
      }
    } else if (strncasecmp(line, "bogomips", sizeof("bogomips") - 1) == 0) {
      const char* freqstr = strchr(line, ':');
      if (freqstr) {
        bogo_clock = strtod(freqstr + 1, &err) * 1000000.0;
        if (freqstr[1] != '\0' && *err == '\0' && bogo_clock > 0)
          saw_bogo = true;
      }
    } else if (strncmp(line, "processor", sizeof("processor") - 1) == 0) {
      // The above comparison is case-sensitive because ARM kernels often
      // include a "Processor" line that tells you about the CPU, distinct
      // from the usual "processor" lines that give you CPU ids. No current
      // Linux architecture is using "Processor" for CPU ids.
      num_cpus++;  // count up every time we see an "processor :" entry
      const char* id_str = strchr(line, ':');
      if (id_str) {
        const long cpu_id = strtol(id_str + 1, &err, 10);
        if (id_str[1] != '\0' && *err == '\0' && max_cpu_id < cpu_id)
          max_cpu_id = cpu_id;
      }
    }
  } while (chars_read > 0);
  close(fd);

  if (!saw_mhz) {
    if (saw_bogo) {
      // If we didn't find anything better, we'll use bogomips, but
      // we're not happy about it.
      cpuinfo_cycles_per_second = bogo_clock;
    } else {
      // If we don't even have bogomips, we'll use the slow estimation.
      cpuinfo_cycles_per_second = static_cast<double>(EstimateCyclesPerSecond());
    }
  }
  if (num_cpus == 0) {
    fprintf(stderr, "Failed to read num. CPUs correctly from /proc/cpuinfo\n");
  } else {
    if ((max_cpu_id + 1) != num_cpus) {
      fprintf(stderr,
              "CPU ID assignments in /proc/cpuinfo seem messed up."
              " This is usually caused by a bad BIOS.\n");
    }
    cpuinfo_num_cpus = num_cpus;
  }

#elif defined BENCHMARK_OS_FREEBSD
// For this sysctl to work, the machine must be configured without
// SMP, APIC, or APM support.  hz should be 64-bit in freebsd 7.0
// and later.  Before that, it's a 32-bit quantity (and gives the
// wrong answer on machines faster than 2^32 Hz).  See
//  http://lists.freebsd.org/pipermail/freebsd-i386/2004-November/001846.html
// But also compare FreeBSD 7.0:
//  http://fxr.watson.org/fxr/source/i386/i386/tsc.c?v=RELENG70#L223
//  231         error = sysctl_handle_quad(oidp, &freq, 0, req);
// To FreeBSD 6.3 (it's the same in 6-STABLE):
//  http://fxr.watson.org/fxr/source/i386/i386/tsc.c?v=RELENG6#L131
//  139         error = sysctl_handle_int(oidp, &freq, sizeof(freq), req);
#if __FreeBSD__ >= 7
  uint64_t hz = 0;
#else
  unsigned int hz = 0;
#endif
  size_t sz = sizeof(hz);
  const char* sysctl_path = "machdep.tsc_freq";
  if (sysctlbyname(sysctl_path, &hz, &sz, nullptr, 0) != 0) {
    fprintf(stderr, "Unable to determine clock rate from sysctl: %s: %s\n",
            sysctl_path, strerror(errno));
    cpuinfo_cycles_per_second = static_cast<double>(EstimateCyclesPerSecond());
  } else {
    cpuinfo_cycles_per_second = hz;
  }
// TODO: also figure out cpuinfo_num_cpus


#elif defined BENCHMARK_OS_WINDOWS
  // In NT, read MHz from the registry. If we fail to do so or we're in win9x
  // then make a crude estimate.
  DWORD data, data_size = sizeof(data);
  if (IsWindowsXPOrGreater() &&
      SUCCEEDED(
          SHGetValueA(HKEY_LOCAL_MACHINE,
                      "HARDWARE\\DESCRIPTION\\System\\CentralProcessor\\0",
                      "~MHz", nullptr, &data, &data_size)))
    cpuinfo_cycles_per_second = static_cast<double>((int64_t)data * (int64_t)(1000 * 1000));  // was mhz
  else
    cpuinfo_cycles_per_second = static_cast<double>(EstimateCyclesPerSecond());

  SYSTEM_INFO sysinfo;
  // Use memset as opposed to = {} to avoid GCC missing initializer false positives.
  std::memset(&sysinfo, 0, sizeof(SYSTEM_INFO));
  GetSystemInfo(&sysinfo);
  cpuinfo_num_cpus = sysinfo.dwNumberOfProcessors; // number of logical processors in the current group

#elif defined BENCHMARK_OS_MACOSX
  // returning "mach time units" per second. the current number of elapsed
  // mach time units can be found by calling uint64 mach_absolute_time();
  // while not as precise as actual CPU cycles, it is accurate in the face
  // of CPU frequency scaling and multi-cpu/core machines.
  // Our mac users have these types of machines, and accuracy
  // (i.e. correctness) trumps precision.
  // See cycleclock.h: CycleClock::Now(), which returns number of mach time
  // units on Mac OS X.
  mach_timebase_info_data_t timebase_info;
  mach_timebase_info(&timebase_info);
  double mach_time_units_per_nanosecond =
      static_cast<double>(timebase_info.denom) /
      static_cast<double>(timebase_info.numer);
  cpuinfo_cycles_per_second = mach_time_units_per_nanosecond * 1e9;

  int num_cpus = 0;
  size_t size = sizeof(num_cpus);
  int numcpus_name[] = {CTL_HW, HW_NCPU};
  if (::sysctl(numcpus_name, arraysize(numcpus_name), &num_cpus, &size, nullptr, 0) ==
          0 &&
      (size == sizeof(num_cpus)))
    cpuinfo_num_cpus = num_cpus;

#else
  // Generic cycles per second counter
  cpuinfo_cycles_per_second = static_cast<double>(EstimateCyclesPerSecond());
#endif
}